

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_transfer_bindings(sqlite3_stmt *pFromStmt,sqlite3_stmt *pToStmt)

{
  Vdbe *pTo;
  Vdbe *pFrom;
  
  if (*(short *)(pFromStmt + 0x20) == *(short *)(pToStmt + 0x20)) {
    if (*(int *)(pToStmt + 0x114) != 0) {
      *(ushort *)(pToStmt + 0xc5) = (*(ushort *)(pToStmt + 0xc5) & 0xfffc) + 1;
    }
    if (*(int *)(pFromStmt + 0x114) != 0) {
      *(ushort *)(pFromStmt + 0xc5) = (*(ushort *)(pFromStmt + 0xc5) & 0xfffc) + 1;
    }
    sqlite3TransferBindings(pFromStmt,pToStmt);
    return 0;
  }
  return 1;
}

Assistant:

SQLITE_API int sqlite3_transfer_bindings(sqlite3_stmt *pFromStmt, sqlite3_stmt *pToStmt){
  Vdbe *pFrom = (Vdbe*)pFromStmt;
  Vdbe *pTo = (Vdbe*)pToStmt;
  if( pFrom->nVar!=pTo->nVar ){
    return SQLITE_ERROR;
  }
  assert( (pTo->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || pTo->expmask==0 );
  if( pTo->expmask ){
    pTo->expired = 1;
  }
  assert( (pFrom->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || pFrom->expmask==0 );
  if( pFrom->expmask ){
    pFrom->expired = 1;
  }
  return sqlite3TransferBindings(pFromStmt, pToStmt);
}